

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_everything_together.cxx
# Opt level: O3

void __thiscall test_event_listener::on_event(test_event_listener *this,raft_event event)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  if (event == become_leader) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,this->srv_id_);
    pcVar3 = " becomes a leader";
    lVar2 = 0x11;
  }
  else if (event == logs_catch_up) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,this->srv_id_);
    pcVar3 = " catch up all logs";
    lVar2 = 0x12;
  }
  else {
    if (event != become_follower) {
      return;
    }
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,this->srv_id_);
    pcVar3 = " becomes a follower";
    lVar2 = 0x13;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

virtual void on_event(raft_event event) override
    {
        switch (event)
        {
            case raft_event::become_follower:
                std::cout << srv_id_ << " becomes a follower" << std::endl;
                break;
            case raft_event::become_leader:
                std::cout << srv_id_ << " becomes a leader" << std::endl;
                break;
            case raft_event::logs_catch_up:
                std::cout << srv_id_ << " catch up all logs" << std::endl;
                break;
        }
    }